

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.h
# Opt level: O2

bool __thiscall QDeadlineTimer::hasExpired(QDeadlineTimer *this)

{
  QDeadlineTimer QVar1;
  
  if (this->t1 != 0x7fffffffffffffff) {
    QVar1 = current((uint)(byte)this->type);
    return this->t1 <= QVar1.t1;
  }
  return false;
}

Assistant:

constexpr bool isForever() const noexcept
    { return t1 == (std::numeric_limits<qint64>::max)(); }